

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateCreateVectorField
          (KotlinKMPGenerator *this,FieldDef *field,CodeWriter *writer,IDLOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string array_param;
  string return_type;
  string method_name;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  BaseType local_90;
  BaseType local_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint16_t local_78;
  _Alloc_hider local_70;
  undefined8 local_60;
  _Alloc_hider local_50;
  undefined8 local_40;
  
  local_90 = (field->value).type.element;
  local_78 = (field->value).type.fixed_length;
  local_8c = BASE_TYPE_NONE;
  local_88 = *(undefined4 *)&(field->value).type.struct_def;
  uStack_84 = *(undefined4 *)((long)&(field->value).type.struct_def + 4);
  uStack_80 = *(undefined4 *)&(field->value).type.enum_def;
  uStack_7c = *(undefined4 *)((long)&(field->value).type.enum_def + 4);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"create","");
  paVar2 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"vector","");
  (*(this->namer_).super_Namer._vptr_Namer[2])
            (&stack0xffffffffffffffb0,&this->namer_,&local_b0,field,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  GenerateKotlinOffsetArray_abi_cxx11_(&local_b0,this,(Type *)&stack0xffffffffffffff70);
  std::operator+(&local_d0,"builder: FlatBufferBuilder, vector:",&local_b0);
  GenType_abi_cxx11_((string *)&stack0xffffffffffffff90,this,&(field->value).type);
  local_110._M_unused._M_object = &local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"size","");
  sVar4 = InlineSize((Type *)&stack0xffffffffffffff70);
  NumToString<unsigned_long>(&local_f0,sVar4);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,(key_type *)&local_110);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  paVar3 = &local_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((code **)local_110._M_unused._0_8_ != &local_100) {
    operator_delete(local_110._M_unused._M_object,(ulong)(local_100 + 1));
  }
  local_110._M_unused._M_object = &local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"align","");
  sVar4 = InlineAlignment((Type *)&stack0xffffffffffffff70);
  NumToString<unsigned_long>(&local_f0,sVar4);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,(key_type *)&local_110);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((code **)local_110._M_unused._0_8_ != &local_100) {
    operator_delete(local_110._M_unused._M_object,(ulong)(local_100 + 1));
  }
  local_110._M_unused._M_object = &local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"root","");
  GenMethod_abi_cxx11_(&local_f0,(KotlinKMPGenerator *)&stack0xffffffffffffff70,type);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,(key_type *)&local_110);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((code **)local_110._M_unused._0_8_ != &local_100) {
    operator_delete(local_110._M_unused._M_object,(ulong)(local_100 + 1));
  }
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:822:9)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:822:9)>
              ::_M_manager;
  local_110._M_unused._M_object = writer;
  GenerateFun(writer,(string *)&stack0xffffffffffffffb0,&local_d0,(string *)&stack0xffffffffffffff90
              ,(function<void_()> *)&local_110,options->gen_jvmstatic);
  if (local_100 != (code *)0x0) {
    (*local_100)(&local_110,&local_110,3);
  }
  if (local_70._M_p != (pointer)&stack0xffffffffffffffa0) {
    operator_delete(local_70._M_p,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p,local_40 + 1);
  }
  return;
}

Assistant:

void GenerateCreateVectorField(FieldDef &field, CodeWriter &writer,
                                 const IDLOptions options) const {
    auto vector_type = field.value.type.VectorType();
    auto method_name = namer_.Method("create", field, "vector");
    auto array_param = GenerateKotlinOffsetArray(vector_type);
    auto params = "builder: FlatBufferBuilder, vector:" + array_param;
    auto return_type = GenType(field.value.type);
    writer.SetValue("size", NumToString(InlineSize(vector_type)));
    writer.SetValue("align", NumToString(InlineAlignment(vector_type)));
    writer.SetValue("root", GenMethod(vector_type));

    GenerateFun(
        writer, method_name, params, return_type,
        [&]() {
          writer += "builder.startVector({{size}}, vector.size, {{align}})";
          writer += "for (i in vector.size - 1 downTo 0) {";
          writer.IncrementIdentLevel();
          writer += "builder.add{{root}}(vector[i])";
          writer.DecrementIdentLevel();
          writer += "}";
          writer += "return builder.endVector()";
        },
        options.gen_jvmstatic);
  }